

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

double ClipperLib::DistanceFromLineSqrd(IntPoint *pt,IntPoint *ln1,IntPoint *ln2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)(ln1->Y - ln2->Y);
  dVar3 = (double)(ln2->X - ln1->X);
  dVar1 = ((double)pt->X * dVar2 + (double)pt->Y * dVar3) -
          ((double)ln1->X * dVar2 + (double)ln1->Y * dVar3);
  return (dVar1 * dVar1) / (dVar2 * dVar2 + dVar3 * dVar3);
}

Assistant:

double DistanceFromLineSqrd(
  const IntPoint& pt, const IntPoint& ln1, const IntPoint& ln2)
{
  //The equation of a line in general form (Ax + By + C = 0)
  //given 2 points (x�,y�) & (x�,y�) is ...
  //(y� - y�)x + (x� - x�)y + (y� - y�)x� - (x� - x�)y� = 0
  //A = (y� - y�); B = (x� - x�); C = (y� - y�)x� - (x� - x�)y�
  //perpendicular distance of point (x�,y�) = (Ax� + By� + C)/Sqrt(A� + B�)
  //see http://en.wikipedia.org/wiki/Perpendicular_distance
  double A = double(ln1.Y - ln2.Y);
  double B = double(ln2.X - ln1.X);
  double C = A * ln1.X  + B * ln1.Y;
  C = A * pt.X + B * pt.Y - C;
  return (C * C) / (A * A + B * B);
}